

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling_test.cpp
# Opt level: O1

void __thiscall VarianceEstimator_Merge_Test::TestBody(VarianceEstimator_Merge_Test *this)

{
  undefined1 auVar1 [16];
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  bool bVar5;
  int iVar6;
  undefined8 *puVar7;
  byte bVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  VarianceEstimator<double> *v;
  undefined1 *puVar12;
  uint uVar13;
  char *pcVar14;
  long lVar15;
  undefined1 auVar16 [16];
  double dVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  float fVar20;
  double dVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined4 in_XMM9_Da;
  undefined4 in_XMM9_Db;
  undefined8 in_XMM9_Qb;
  AssertionResult gtest_ar;
  Float err;
  VarianceEstimator<double> veFinal;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60;
  AssertHelper local_58;
  internal local_50 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  float local_3c;
  undefined1 local_38 [16];
  long local_28;
  double local_20;
  
  puVar7 = (undefined8 *)operator_new(0x180);
  *puVar7 = 0;
  puVar7[1] = 0;
  puVar7[2] = 0;
  puVar7[3] = 0;
  puVar7[4] = 0;
  puVar7[5] = 0;
  puVar7[6] = 0;
  puVar7[7] = 0;
  puVar7[8] = 0;
  puVar7[9] = 0;
  puVar7[10] = 0;
  puVar7[0xb] = 0;
  puVar7[0xc] = 0;
  puVar7[0xd] = 0;
  puVar7[0xe] = 0;
  puVar7[0xf] = 0;
  puVar7[0x10] = 0;
  puVar7[0x11] = 0;
  puVar7[0x12] = 0;
  puVar7[0x13] = 0;
  puVar7[0x14] = 0;
  puVar7[0x15] = 0;
  puVar7[0x16] = 0;
  puVar7[0x17] = 0;
  puVar7[0x18] = 0;
  puVar7[0x19] = 0;
  puVar7[0x1a] = 0;
  puVar7[0x1b] = 0;
  puVar7[0x1c] = 0;
  puVar7[0x1d] = 0;
  puVar7[0x1e] = 0;
  puVar7[0x1f] = 0;
  puVar7[0x20] = 0;
  puVar7[0x21] = 0;
  puVar7[0x22] = 0;
  puVar7[0x23] = 0;
  puVar7[0x24] = 0;
  puVar7[0x25] = 0;
  puVar7[0x26] = 0;
  puVar7[0x27] = 0;
  puVar7[0x28] = 0;
  puVar7[0x29] = 0;
  puVar7[0x2a] = 0;
  puVar7[0x2b] = 0;
  puVar7[0x2c] = 0;
  puVar7[0x2d] = 0;
  puVar7[0x2e] = 0;
  puVar7[0x2f] = 0;
  puVar12 = &DAT_5851f42d4c957f2e;
  iVar6 = 0;
  uVar10 = 0x853c49e6748fea9b;
  local_20 = 0.0;
  do {
    uVar13 = (uint)((ulong)puVar12 >> 0x2d) ^ (uint)((ulong)puVar12 >> 0x1b);
    bVar8 = (byte)((ulong)puVar12 >> 0x3b);
    auVar16._4_4_ = in_XMM9_Db;
    auVar16._0_4_ = in_XMM9_Da;
    auVar16._8_8_ = in_XMM9_Qb;
    auVar16 = vcvtusi2ss_avx512f(auVar16,uVar13 >> bVar8 | uVar13 << 0x20 - bVar8);
    auVar16 = vminss_avx(ZEXT416((uint)(auVar16._0_4_ * 2.3283064e-10)),
                         SUB6416(ZEXT464(0x3f7fffff),0));
    fVar20 = (auVar16._0_4_ + (float)iVar6) / 10000.0;
    uVar11 = uVar10;
    do {
      uVar10 = uVar11 * 0x5851f42d4c957f2d + 0xda3e39cb94b95bdb;
      uVar13 = (uint)(uVar11 >> 0x2d) ^ (uint)(uVar11 >> 0x1b);
      bVar8 = (byte)(uVar11 >> 0x3b);
      uVar13 = uVar13 >> bVar8 | uVar13 << 0x20 - bVar8;
      uVar11 = uVar10;
    } while ((int)uVar13 < 0);
    puVar12 = (undefined1 *)((long)puVar12 * 0x5851f42d4c957f2d + 1);
    lVar9 = (long)(int)(uVar13 & 0xf);
    dVar21 = (double)(fVar20 - (1.0 - fVar20));
    lVar15 = puVar7[lVar9 * 3 + 2];
    puVar7[lVar9 * 3 + 2] = lVar15 + 1;
    dVar2 = dVar21 - (double)puVar7[lVar9 * 3];
    dVar17 = (double)puVar7[lVar9 * 3] + dVar2 / (double)(lVar15 + 1);
    puVar7[lVar9 * 3] = dVar17;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = puVar7[lVar9 * 3 + 1];
    auVar22._8_8_ = 0;
    auVar22._0_8_ = dVar21 - dVar17;
    auVar23._8_8_ = 0;
    auVar23._0_8_ = dVar2;
    auVar16 = vfmadd213sd_fma(auVar22,auVar23,auVar1);
    puVar7[lVar9 * 3 + 1] = auVar16._0_8_;
    local_20 = local_20 + dVar21;
    iVar6 = iVar6 + 1;
  } while (iVar6 != 10000);
  local_38._0_12_ = ZEXT812(0);
  local_38._12_4_ = 0;
  local_28 = 0;
  lVar15 = 0;
  do {
    pbrt::VarianceEstimator<double>::Merge
              ((VarianceEstimator<double> *)local_38,
               (VarianceEstimator<double> *)((long)puVar7 + lVar15));
    lVar15 = lVar15 + 0x18;
  } while (lVar15 != 0x180);
  dVar17 = (double)local_38._8_8_ / (double)(local_28 + -1) + -0.3333333333333333;
  auVar18._0_4_ = (float)dVar17;
  auVar18._4_4_ = (int)((ulong)dVar17 >> 0x20);
  auVar18._8_8_ = 0;
  auVar3._8_4_ = 0x7fffffff;
  auVar3._0_8_ = 0x7fffffff7fffffff;
  auVar3._12_4_ = 0x7fffffff;
  auVar16 = vandps_avx512vl(auVar18,auVar3);
  local_3c = (float)((uint)(1 < local_28) * auVar16._0_4_ + (uint)(1 >= local_28) * 0x3eaaaaab);
  local_60.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       &DAT_3f50624dd2f1a9fc;
  testing::internal::CmpHelperLT<float,double>(local_50,"err","1e-3",&local_3c,(double *)&local_60);
  if (local_50[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_60);
    std::ostream::_M_insert<double>
              ((double)((ulong)(1 < local_28) *
                       (long)((double)local_38._8_8_ / (double)(local_28 + -1))));
    if (local_48.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar14 = "";
    }
    else {
      pcVar14 = ((local_48.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/sampling_test.cpp"
               ,0x3be,pcVar14);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if (local_60.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar5 = testing::internal::IsTrue(true);
      if ((bVar5) &&
         (local_60.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_60.ptr_ + 8))();
      }
      local_60.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_48,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  dVar17 = (local_20 / 10000.0 - (double)local_38._0_8_) / (local_20 / 10000.0);
  auVar19._0_4_ = (float)dVar17;
  auVar19._4_4_ = (int)((ulong)dVar17 >> 0x20);
  auVar19._8_8_ = 0;
  auVar4._8_4_ = 0x7fffffff;
  auVar4._0_8_ = 0x7fffffff7fffffff;
  auVar4._12_4_ = 0x7fffffff;
  auVar16 = vandps_avx512vl(auVar19,auVar4);
  local_3c = auVar16._0_4_;
  local_60.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       &DAT_3ee4f8b588e368f1;
  testing::internal::CmpHelperLT<float,double>(local_50,"err","1e-5",&local_3c,(double *)&local_60);
  if (local_50[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_60);
    if (local_48.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar14 = "";
    }
    else {
      pcVar14 = ((local_48.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/sampling_test.cpp"
               ,0x3c1,pcVar14);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if (local_60.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar5 = testing::internal::IsTrue(true);
      if ((bVar5) &&
         (local_60.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_60.ptr_ + 8))();
      }
      local_60.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_48,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  operator_delete(puVar7,0x180);
  return;
}

Assistant:

TEST(VarianceEstimator, Merge) {
    int n = 16;
    std::vector<VarianceEstimator<double>> ve(n);

    RNG rng;
    int count = 10000;
    double sum = 0;
    for (Float u : Stratified1D(count)) {
        Float v = Lerp(u, -1, 1);
        int index = rng.Uniform<int>(ve.size());
        ve[index].Add(v);
        sum += v;
    }

    VarianceEstimator<double> veFinal;
    for (const auto &v : ve)
        veFinal.Merge(v);

    // f(x) = 0, random variables x_i uniform in [-1,1] ->
    // variance is E[x^2] on [-1,1] == 1/3
    Float err = std::abs(veFinal.Variance() - 1. / 3.);
    EXPECT_LT(err, 1e-3) << veFinal.Variance();

    err = std::abs((sum / count - veFinal.Mean()) / (sum / count));
    EXPECT_LT(err, 1e-5);
}